

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

void __thiscall proto2_unittest::TestChildExtensionData::Clear(TestChildExtensionData *this)

{
  ulong uVar1;
  TestChildExtensionData_NestedTestAllExtensionsData *this_00;
  anon_union_32_1_493b367e_for_TestChildExtensionData_3 aVar2;
  undefined8 *puVar3;
  char *failure_msg;
  int line;
  char *file;
  LogMessageFatal LStack_18;
  
  aVar2 = this->field_0;
  if (((undefined1  [32])aVar2 & (undefined1  [32])0x7) == (undefined1  [32])0x0) goto LAB_00cb713f;
  if (((undefined1  [32])aVar2 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
    uVar1 = *(ulong *)((long)&this->field_0 + 8);
    if ((uVar1 & 3) != 0) {
      puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
      goto LAB_00cb710e;
    }
LAB_00cb7163:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
    ;
    failure_msg = "!tagged_ptr_.IsDefault()";
    line = 0x20b;
LAB_00cb7197:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_18,file,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
  }
LAB_00cb710e:
  if (((undefined1  [32])aVar2 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
    uVar1 = *(ulong *)((long)&this->field_0 + 0x10);
    if ((uVar1 & 3) == 0) goto LAB_00cb7163;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    puVar3[1] = 0;
    *(undefined1 *)*puVar3 = 0;
  }
  if (((undefined1  [32])aVar2 & (undefined1  [32])0x4) != (undefined1  [32])0x0) {
    this_00 = (this->field_0)._impl_.optional_extension_;
    if (this_00 == (TestChildExtensionData_NestedTestAllExtensionsData *)0x0) {
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest.pb.cc"
      ;
      failure_msg = "_impl_.optional_extension_ != nullptr";
      line = 0x3d16;
      goto LAB_00cb7197;
    }
    TestChildExtensionData_NestedTestAllExtensionsData::Clear(this_00);
  }
LAB_00cb713f:
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestChildExtensionData::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestChildExtensionData)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.a_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.b_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.optional_extension_ != nullptr);
      _impl_.optional_extension_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}